

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<135UL,_GF2::MOLex<135UL>_> * __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::operator%=
          (MP<135UL,_GF2::MOLex<135UL>_> *this,MM<135UL> *mRight)

{
  bool bVar1;
  MP<135UL,_GF2::MOLex<135UL>_> *in_RDI;
  iterator iter;
  _List_const_iterator<GF2::MM<135UL>_> in_stack_ffffffffffffffd0;
  iterator in_stack_ffffffffffffffd8;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::begin
                 (&in_RDI->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::end
                   (&in_RDI->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    std::_List_iterator<GF2::MM<135UL>_>::operator->((_List_iterator<GF2::MM<135UL>_> *)0x17d06e);
    bVar1 = MM<135UL>::IsDivisibleBy
                      ((MM<135UL> *)in_stack_ffffffffffffffd8._M_node,
                       (MM<135UL> *)in_stack_ffffffffffffffd0._M_node);
    if (bVar1) {
      std::_List_const_iterator<GF2::MM<135UL>_>::_List_const_iterator
                ((_List_const_iterator<GF2::MM<135UL>_> *)&stack0xffffffffffffffd0,local_18);
      in_stack_ffffffffffffffd8 =
           std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::erase
                     (in_stack_ffffffffffffffd0._M_node,in_stack_ffffffffffffffd8._M_node);
      local_18[0]._M_node = in_stack_ffffffffffffffd8._M_node;
    }
    else {
      std::_List_iterator<GF2::MM<135UL>_>::operator++(local_18);
    }
  }
  return in_RDI;
}

Assistant:

MP& operator%=(const MM<_n>& mRight)
	{	
		for (iterator iter = begin(); iter != end();)
			if (iter->IsDivisibleBy(mRight)) 
				iter = erase(iter);
			else ++iter;
		return *this;
	}